

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# items.cpp
# Opt level: O1

void __thiscall CItems::RenderProjectile(CItems *this,CNetObj_Projectile *pCurrent,int ItemID)

{
  int iVar1;
  int iVar2;
  CGameClient *pCVar3;
  CNetObj_GameData *pCVar4;
  IClient *pIVar5;
  IGraphics *pIVar6;
  undefined1 auVar7 [12];
  bool bVar8;
  uint uVar9;
  CEffects *this_00;
  long in_FS_OFFSET;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 extraout_var [12];
  undefined1 auVar12 [16];
  float fVar13;
  undefined4 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_58;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_54;
  vec2 local_38;
  undefined8 uStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar9 = pCurrent->m_Type - 1;
  auVar11 = ZEXT816(0);
  if (uVar9 < 3) {
    pCVar3 = (this->super_CComponent).m_pClient;
    auVar11._0_4_ =
         (float)*(int *)((long)(pCVar3->m_All).m_paComponents +
                        *(long *)(&DAT_001dbf68 + (ulong)uVar9 * 8) + -0x10);
    auVar11._4_4_ =
         (float)*(int *)((long)(pCVar3->m_All).m_paComponents +
                        *(long *)(&DAT_001dbf80 + (ulong)uVar9 * 8) + -0x10);
    auVar11._8_8_ = 0;
    auVar11 = divps(auVar11,_DAT_001dbeb0);
  }
  if (RenderProjectile(CNetObj_Projectile_const*,int)::s_LastGameTickTime == '\0') {
    RenderProjectile(this);
  }
  pCVar3 = (this->super_CComponent).m_pClient;
  pCVar4 = (pCVar3->m_Snap).m_pGameData;
  if (((pCVar4 == (CNetObj_GameData *)0x0) || ((pCVar4->m_GameStateFlags & 0x1c) == 0)) &&
     (bVar8 = CGameClient::IsDemoPlaybackPaused(pCVar3), !bVar8)) {
    RenderProjectile::s_LastGameTickTime =
         ((this->super_CComponent).m_pClient)->m_pClient->m_GameTickTime;
  }
  bVar8 = CGameClient::ShouldUsePredicted((this->super_CComponent).m_pClient);
  if ((bVar8) &&
     (pCVar3 = (this->super_CComponent).m_pClient, pCVar3->m_pConfig->m_ClPredictProjectiles != 0))
  {
    pIVar5 = pCVar3->m_pClient;
    fVar10 = ((float)(~pCurrent->m_StartTick + pIVar5->m_PredTick) + pIVar5->m_PredIntraTick) / 50.0
    ;
  }
  else {
    fVar10 = (float)(((this->super_CComponent).m_pClient)->m_pClient->m_PrevGameTick -
                    pCurrent->m_StartTick) / 50.0 + RenderProjectile::s_LastGameTickTime;
  }
  if ((0.0 <= fVar10) ||
     (bVar8 = RenderProjectile::s_LastGameTickTime * -0.5 < fVar10, fVar10 = 0.0, bVar8)) {
    iVar1 = pCurrent->m_X;
    iVar2 = pCurrent->m_Y;
    fVar13 = (float)pCurrent->m_VelY / 100.0;
    uVar14 = auVar11._0_4_;
    fVar17 = auVar11._4_4_ * fVar10;
    auVar7._4_8_ = auVar11._8_8_;
    auVar7._0_4_ = uVar14;
    auVar16._0_8_ = auVar7._0_8_ << 0x20;
    auVar16._8_4_ = uVar14;
    auVar16._12_4_ = uVar14;
    auVar15._4_12_ = auVar16._4_12_;
    auVar15._0_4_ = (float)pCurrent->m_VelX;
    auVar16 = divps(auVar15,_DAT_001dbec0);
    local_58.x = fVar17 * auVar16._0_4_ + (float)iVar1;
    aStack_54.y = fVar17 * fVar17 * auVar16._4_4_ + fVar13 * fVar17 + (float)iVar2;
    fVar10 = (fVar10 + -0.001) * auVar11._4_4_;
    pIVar6 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    (*(pIVar6->super_IInterface)._vptr_IInterface[0x13])
              (pIVar6,(ulong)(uint)g_pData->m_aImages[1].m_Id.m_Id);
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])
              ();
    uVar9 = 5;
    if (pCurrent->m_Type < 5) {
      uVar9 = pCurrent->m_Type;
    }
    if ((int)uVar9 < 1) {
      uVar9 = 0;
    }
    CRenderTools::SelectSprite
              (&((this->super_CComponent).m_pClient)->m_RenderTools,
               (g_pData->m_Weapons).m_aId[uVar9].m_pSpriteProj,0,0,0);
    fVar17 = local_58.x - (fVar10 * auVar16._0_4_ + (float)iVar1);
    fVar10 = aStack_54.y - (fVar10 * fVar10 * auVar16._4_4_ + fVar13 * fVar10 + (float)iVar2);
    this_00 = ((this->super_CComponent).m_pClient)->m_pEffects;
    if (pCurrent->m_Type == 3) {
      CEffects::SmokeTrail(this_00,_local_58,(vec2)(CONCAT44(fVar10,fVar17) ^ 0x8000000080000000));
      fVar10 = ((this->super_CComponent).m_pClient)->m_pClient->m_LocalTime;
      if (RenderProjectile(CNetObj_Projectile_const*,int)::s_LastLocalTime == '\0') {
        RenderProjectile((CItems *)this_00);
      }
      fVar13 = fVar10 - RenderProjectile::s_LastLocalTime;
      fVar17 = CGameClient::GetAnimationPlaybackSpeed((this->super_CComponent).m_pClient);
      RenderProjectile::s_Time = fVar17 * fVar13 + RenderProjectile::s_Time;
      fVar13 = RenderProjectile::s_Time * 3.1415927 + RenderProjectile::s_Time * 3.1415927;
      auVar12._0_4_ = fVar13 + fVar13 + (float)ItemID;
      auVar12._4_12_ = extraout_var;
      (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x19]
      )(auVar12._0_8_);
      RenderProjectile::s_LastLocalTime = fVar10;
    }
    else {
      CEffects::BulletTrail(this_00,_local_58);
      pIVar6 = ((this->super_CComponent).m_pClient)->m_pGraphics;
      fVar13 = fVar17 * fVar17 + fVar10 * fVar10;
      if (fVar13 < 0.0) {
        fVar13 = sqrtf(fVar13);
      }
      else {
        fVar13 = SQRT(fVar13);
      }
      if (1e-05 < fVar13) {
        atan2f(fVar10,fVar17);
      }
      (*(pIVar6->super_IInterface)._vptr_IInterface[0x19])(pIVar6);
    }
    local_38 = _local_58;
    uStack_30 = 0x4200000042000000;
    pIVar6 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    (*(pIVar6->super_IInterface)._vptr_IInterface[0x1c])(pIVar6,&local_38,1);
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x19])
              ();
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])
              ();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CItems::RenderProjectile(const CNetObj_Projectile *pCurrent, int ItemID)
{
	// get positions
	float Curvature = 0;
	float Speed = 0;
	if(pCurrent->m_Type == WEAPON_GRENADE)
	{
		Curvature = m_pClient->m_Tuning.m_GrenadeCurvature;
		Speed = m_pClient->m_Tuning.m_GrenadeSpeed;
	}
	else if(pCurrent->m_Type == WEAPON_SHOTGUN)
	{
		Curvature = m_pClient->m_Tuning.m_ShotgunCurvature;
		Speed = m_pClient->m_Tuning.m_ShotgunSpeed;
	}
	else if(pCurrent->m_Type == WEAPON_GUN)
	{
		Curvature = m_pClient->m_Tuning.m_GunCurvature;
		Speed = m_pClient->m_Tuning.m_GunSpeed;
	}

	static float s_LastGameTickTime = Client()->GameTickTime();
	if(!m_pClient->IsWorldPaused() && !m_pClient->IsDemoPlaybackPaused())
		s_LastGameTickTime = Client()->GameTickTime();

	float Ct;
	if(m_pClient->ShouldUsePredicted() && Config()->m_ClPredictProjectiles)
		Ct = ((float)(Client()->PredGameTick() - 1 - pCurrent->m_StartTick) + Client()->PredIntraGameTick())/(float)SERVER_TICK_SPEED;
	else
		Ct = (Client()->PrevGameTick()-pCurrent->m_StartTick)/(float)SERVER_TICK_SPEED + s_LastGameTickTime;
	if(Ct < 0)
	{
		if(Ct > -s_LastGameTickTime / 2)
		{
			// Fixup the timing which might be screwed during demo playback because
			// s_LastGameTickTime depends on the system timer, while the other part
			// Client()->PrevGameTick()-pCurrent->m_StartTick)/(float)SERVER_TICK_SPEED
			// is virtually constant (for projectiles fired on the current game tick):
			// (x - (x+2)) / 50 = -0.04
			//
			// We have a strict comparison for the passed time being more than the time between ticks
			// if(CurtickStart > m_Info.m_CurrentTime) in CDemoPlayer::Update()
			// so on the practice the typical value of s_LastGameTickTime varies from 0.02386 to 0.03999
			// which leads to Ct from -0.00001 to -0.01614.
			// Round up those to 0.0 to fix missing rendering of the projectile.
			Ct = 0;
		}
		else
		{
			return; // projectile haven't been shot yet
		}
	}

	vec2 StartPos(pCurrent->m_X, pCurrent->m_Y);
	vec2 StartVel(pCurrent->m_VelX/100.0f, pCurrent->m_VelY/100.0f);
	vec2 Pos = CalcPos(StartPos, StartVel, Curvature, Speed, Ct);
	vec2 PrevPos = CalcPos(StartPos, StartVel, Curvature, Speed, Ct-0.001f);

	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_GAME].m_Id);
	Graphics()->QuadsBegin();

	RenderTools()->SelectSprite(g_pData->m_Weapons.m_aId[clamp(pCurrent->m_Type, 0, NUM_WEAPONS-1)].m_pSpriteProj);
	const vec2 Vel = Pos-PrevPos;

	// add particle for this projectile
	if(pCurrent->m_Type == WEAPON_GRENADE)
	{
		m_pClient->m_pEffects->SmokeTrail(Pos, Vel*-1);
		const float Now = Client()->LocalTime();
		static float s_Time = 0.0f;
		static float s_LastLocalTime = Now;
		s_Time += (Now - s_LastLocalTime) * m_pClient->GetAnimationPlaybackSpeed();
		Graphics()->QuadsSetRotation(s_Time*pi*2*2 + ItemID);
		s_LastLocalTime = Now;
	}
	else
	{
		m_pClient->m_pEffects->BulletTrail(Pos);
		Graphics()->QuadsSetRotation(length(Vel) > 0.00001f ? angle(Vel) : 0);
	}

	IGraphics::CQuadItem QuadItem(Pos.x, Pos.y, 32, 32);
	Graphics()->QuadsDraw(&QuadItem, 1);
	Graphics()->QuadsSetRotation(0);
	Graphics()->QuadsEnd();
}